

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BuiltinVariableRenderTest::init
          (BuiltinVariableRenderTest *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  VariableTest VVar3;
  _Alloc_hider _Var4;
  BuiltinVariableRenderTest *this_00;
  bool bVar5;
  ContextType ctxType;
  int iVar6;
  undefined4 extraout_var;
  ShaderProgram *this_01;
  ShaderProgramDeclaration *pSVar7;
  size_t sVar8;
  pointer __dest;
  NotSupportedError *pNVar9;
  long lVar10;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  bool *__s;
  size_type __dnew;
  float requiredPointSize;
  ostringstream buf;
  ContextType local_464;
  string local_460;
  long *local_440;
  long local_438;
  long local_430 [2];
  GeometrySource local_420;
  string local_400;
  VertexSource local_3e0;
  VertexAttribute local_3c0;
  undefined1 local_398 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  GenericVecType local_378;
  BuiltinVariableRenderTest *local_370;
  long *local_368;
  undefined8 local_360;
  long local_358;
  undefined2 local_350;
  undefined1 local_34e;
  FragmentOutput local_344;
  string local_340;
  FragmentSource local_320;
  string local_300;
  GeometryToFragmentVarying local_2e0;
  VertexToGeometryVarying local_2d8;
  undefined1 local_2d0 [376];
  GeometryShaderDeclaration local_158;
  ShaderProgramDeclaration local_140;
  
  if (this->m_test == TEST_POINT_SIZE) {
    local_3c0.name._M_dataplus._M_p._0_4_ = 0x40a00000;
    local_398._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x3f8000003f800000;
    ctxType.super_ApiType.m_bits =
         (ApiType)(*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
                    _vptr_RenderContext[2])();
    bVar5 = glu::contextSupports(ctxType,(ApiType)0x144);
    if ((!bVar5) &&
       (bVar5 = glu::ContextInfo::isExtensionSupported
                          (((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->
                           m_contextInfo,"GL_EXT_geometry_point_size"), !bVar5)) {
      pNVar9 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar9,"Tests require GL_EXT_geometry_point_size extension.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                 ,0xa2c);
      __cxa_throw(pNVar9,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    iVar6 = (*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar6) + 0x818))(0x846d,local_398);
    if ((float)local_398._4_4_ < 5.0) goto LAB_013e1eb3;
  }
  this_01 = (ShaderProgram *)operator_new(0x158);
  local_464.super_ApiType.m_bits =
       (ApiType)(*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[2])();
  VVar3 = this->m_test;
  (this_01->super_VertexShader)._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_0215f240;
  (this_01->super_GeometryShader)._vptr_GeometryShader = (_func_int **)&DAT_0215f278;
  (this_01->super_FragmentShader)._vptr_FragmentShader = (_func_int **)&DAT_0215f290;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_140);
  local_368 = &local_358;
  local_358 = 0x697469736f705f61;
  local_350 = 0x6e6f;
  local_360 = 10;
  local_34e = 0;
  local_398._0_8_ = &local_388;
  std::__cxx11::string::_M_construct<char*>((string *)local_398);
  local_378 = GENERICVECTYPE_FLOAT;
  pSVar7 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,(VertexAttribute *)local_398)
  ;
  if (VVar3 < TEST_LAST) {
    __s = (bool *)(&DAT_01c3a214 + *(int *)(&DAT_01c3a214 + (ulong)VVar3 * 4));
  }
  else {
    __s = ::glcts::fixed_sample_locations_values + 1;
  }
  local_440 = local_430;
  local_370 = this;
  sVar8 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,__s,__s + sVar8);
  local_3c0.name._M_dataplus._M_p = (pointer)&local_3c0.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3c0,local_440,local_438 + (long)local_440);
  local_3c0.type = GENERICVECTYPE_FLOAT;
  pSVar7 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar7,&local_3c0);
  local_2d8.type = GENERICVECTYPE_FLOAT;
  local_2d8.flatshade = false;
  pSVar7 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar7,&local_2d8);
  local_2e0.type = GENERICVECTYPE_FLOAT;
  local_2e0.flatshade = false;
  pSVar7 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar7,&local_2e0);
  local_344.type = GENERICVECTYPE_FLOAT;
  pSVar7 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar7,&local_344);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2d0,"${GLSL_VERSION_DECL}\nin highp vec4 a_position;\n",0x2f);
  if (VVar3 == TEST_POINT_SIZE) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2d0,"in highp vec4 a_pointSize;\n",0x1b);
    lVar10 = 0x21;
    pcVar12 = "out highp vec4 v_geom_pointSize;\n";
LAB_013e1857:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d0,pcVar12,lVar10);
  }
  else if (VVar3 == TEST_PRIMITIVE_ID) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2d0,"in highp vec4 a_primitiveID;\n",0x1d);
    lVar10 = 0x23;
    pcVar12 = "out highp vec4 v_geom_primitiveID;\n";
    goto LAB_013e1857;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2d0,
             "void main (void)\n{\n\tgl_Position = a_position;\n\tgl_PointSize = 1.0;\n",0x43);
  if (VVar3 == TEST_POINT_SIZE) {
    lVar10 = 0x21;
    pcVar12 = "\tv_geom_pointSize = a_pointSize;\n";
LAB_013e18a2:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d0,pcVar12,lVar10);
  }
  else if (VVar3 == TEST_PRIMITIVE_ID) {
    lVar10 = 0x25;
    pcVar12 = "\tv_geom_primitiveID = a_primitiveID;\n";
    goto LAB_013e18a2;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d0,"}\n",2);
  std::__cxx11::stringbuf::str();
  specializeShader(&local_300,&local_460,&local_464);
  paVar1 = &local_460.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != paVar1) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d0);
  std::ios_base::~ios_base((ios_base *)(local_2d0 + 0x70));
  local_3e0.source._M_dataplus._M_p = (pointer)&local_3e0.source.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3e0,local_300._M_dataplus._M_p,
             local_300._M_dataplus._M_p + local_300._M_string_length);
  pSVar7 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar7,&local_3e0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d0);
  if (VVar3 < TEST_PRIMITIVE_ID) {
    local_420.source._M_dataplus._M_p = (pointer)0x9c;
    local_460._M_dataplus._M_p = (pointer)paVar1;
    __dest = (pointer)std::__cxx11::string::_M_create((ulong *)&local_460,(ulong)&local_420);
    _Var4._M_p = local_420.source._M_dataplus._M_p;
    local_460.field_2._M_allocated_capacity = (size_type)local_420.source._M_dataplus._M_p;
    local_460._M_dataplus._M_p = __dest;
    memcpy(__dest,
           "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nin mediump vec4 v_frag_FragColor;\nvoid main (void)\n{\n\tfragColor = v_frag_FragColor;\n}\n"
           ,0x9c);
    local_460._M_string_length = (size_type)_Var4._M_p;
    __dest[_Var4._M_p] = '\0';
    specializeShader(&local_400,&local_460,&local_464);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != paVar1) {
      operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (VVar3 != TEST_PRIMITIVE_ID) {
      local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
      std::__throw_logic_error("basic_string::_M_construct null not valid");
LAB_013e1eb3:
      pNVar9 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      de::toString<float>((string *)&local_140,(float *)&local_3c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                     "Test case requires point size ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_140
                    );
      tcu::NotSupportedError::NotSupportedError(pNVar9,(string *)local_2d0);
      __cxa_throw(pNVar9,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2d0,
               "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tconst mediump vec4 red = vec4(1.0, 0.0, 0.0, 1.0);\n\tconst mediump vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n\tconst mediump vec4 blue = vec4(0.0, 0.0, 1.0, 1.0);\n\tconst mediump vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n\tconst mediump vec4 colors[4] = vec4[4](yellow, red, green, blue);\n\tfragColor = colors[gl_PrimitiveID % 4];\n}\n"
               ,0x1b8);
    std::__cxx11::stringbuf::str();
    specializeShader(&local_400,&local_460,&local_464);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != paVar1) {
      operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d0);
  std::ios_base::~ios_base((ios_base *)(local_2d0 + 0x70));
  paVar2 = &local_320.source.field_2;
  local_320.source._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_320,local_400._M_dataplus._M_p,
             local_400._M_dataplus._M_p + local_400._M_string_length);
  pSVar7 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar7,&local_320);
  local_158.outputType = (uint)(VVar3 != TEST_POINT_SIZE) * 2;
  local_158.numOutputVertices = (ulong)local_158.outputType + 1;
  local_158.inputType = GEOMETRYSHADERINPUTTYPE_POINTS;
  local_158.numInvocations = 1;
  pSVar7 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar7,&local_158);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2d0,"${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}",0x30);
  if (VVar3 == TEST_POINT_SIZE) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2d0,"#extension GL_EXT_geometry_point_size : require\n",0x30);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2d0,"layout(points) in;\n",0x13);
  if (VVar3 == TEST_POINT_SIZE) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2d0,"layout(points, max_vertices = 1) out;\n",0x26);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2d0,"in highp vec4 v_geom_pointSize[];\n",0x22);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2d0,"layout(triangle_strip, max_vertices = 3) out;\n",0x2e);
    if (VVar3 == TEST_PRIMITIVE_ID) {
      lVar10 = 0x24;
      pcVar12 = "in highp vec4 v_geom_primitiveID[];\n";
      goto LAB_013e1bc9;
    }
  }
  lVar10 = 0x21;
  pcVar12 = "out highp vec4 v_frag_FragColor;\n";
LAB_013e1bc9:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d0,pcVar12,lVar10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2d0,"\nvoid main (void)\n{\n",0x14);
  pcVar12 = 
  "\tgl_Position = gl_in[0].gl_Position + vec4(0.05, 0.0, 0.0, 0.0);\n\tgl_PrimitiveID = int(floor(v_geom_primitiveID[0].x)) + 3;\n\tEmitVertex();\n\n\tgl_Position = gl_in[0].gl_Position - vec4(0.05, 0.0, 0.0, 0.0);\n\tgl_PrimitiveID = int(floor(v_geom_primitiveID[0].x)) + 3;\n\tEmitVertex();\n\n\tgl_Position = gl_in[0].gl_Position + vec4(0.0, 0.05, 0.0, 0.0);\n\tgl_PrimitiveID = int(floor(v_geom_primitiveID[0].x)) + 3;\n\tEmitVertex();\n\n"
  ;
  if (VVar3 == TEST_PRIMITIVE_ID_IN) {
    pcVar12 = 
    "\tconst highp vec4 red = vec4(1.0, 0.0, 0.0, 1.0);\n\tconst highp vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n\tconst highp vec4 blue = vec4(0.0, 0.0, 1.0, 1.0);\n\tconst highp vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n\tconst highp vec4 colors[4] = vec4[4](red, green, blue, yellow);\n\n\tgl_Position = gl_in[0].gl_Position + vec4(0.05, 0.0, 0.0, 0.0);\n\tv_frag_FragColor = colors[gl_PrimitiveIDIn % 4];\n\tEmitVertex();\n\n\tgl_Position = gl_in[0].gl_Position - vec4(0.05, 0.0, 0.0, 0.0);\n\tv_frag_FragColor = colors[gl_PrimitiveIDIn % 4];\n\tEmitVertex();\n\n\tgl_Position = gl_in[0].gl_Position + vec4(0.0, 0.05, 0.0, 0.0);\n\tv_frag_FragColor = colors[gl_PrimitiveIDIn % 4];\n\tEmitVertex();\n"
    ;
  }
  lVar10 = 0x1a4;
  if (VVar3 == TEST_PRIMITIVE_ID_IN) {
    lVar10 = 0x298;
  }
  pcVar13 = 
  "\tgl_Position = gl_in[0].gl_Position;\n\tgl_PointSize = v_geom_pointSize[0].x + 1.0;\n\tv_frag_FragColor = vec4(1.0, 1.0, 1.0, 1.0);\n\tEmitVertex();\n"
  ;
  if (VVar3 != TEST_POINT_SIZE) {
    pcVar13 = pcVar12;
  }
  lVar11 = 0x8f;
  if (VVar3 != TEST_POINT_SIZE) {
    lVar11 = lVar10;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d0,pcVar13,lVar11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d0,"}\n",2);
  std::__cxx11::stringbuf::str();
  specializeShader(&local_340,&local_460,&local_464);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != paVar1) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d0);
  std::ios_base::~ios_base((ios_base *)(local_2d0 + 0x70));
  paVar1 = &local_420.source.field_2;
  local_420.source._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_420,local_340._M_dataplus._M_p,
             local_340._M_dataplus._M_p + local_340._M_string_length);
  pSVar7 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar7,&local_420);
  sglr::ShaderProgram::ShaderProgram(this_01,pSVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420.source._M_dataplus._M_p != paVar1) {
    pSVar7 = (ShaderProgramDeclaration *)(local_420.source.field_2._M_allocated_capacity + 1);
    operator_delete(local_420.source._M_dataplus._M_p,(ulong)pSVar7);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    pSVar7 = (ShaderProgramDeclaration *)(local_340.field_2._M_allocated_capacity + 1);
    operator_delete(local_340._M_dataplus._M_p,(ulong)pSVar7);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320.source._M_dataplus._M_p != paVar2) {
    pSVar7 = (ShaderProgramDeclaration *)(local_320.source.field_2._M_allocated_capacity + 1);
    operator_delete(local_320.source._M_dataplus._M_p,(ulong)pSVar7);
  }
  this_00 = local_370;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    pSVar7 = (ShaderProgramDeclaration *)(local_400.field_2._M_allocated_capacity + 1);
    operator_delete(local_400._M_dataplus._M_p,(ulong)pSVar7);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0.source._M_dataplus._M_p != &local_3e0.source.field_2) {
    pSVar7 = (ShaderProgramDeclaration *)(local_3e0.source.field_2._M_allocated_capacity + 1);
    operator_delete(local_3e0.source._M_dataplus._M_p,(ulong)pSVar7);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    pSVar7 = (ShaderProgramDeclaration *)(local_300.field_2._M_allocated_capacity + 1);
    operator_delete(local_300._M_dataplus._M_p,(ulong)pSVar7);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.name._M_dataplus._M_p != &local_3c0.name.field_2) {
    pSVar7 = (ShaderProgramDeclaration *)(local_3c0.name.field_2._M_allocated_capacity + 1);
    operator_delete(local_3c0.name._M_dataplus._M_p,(ulong)pSVar7);
  }
  if (local_440 != local_430) {
    pSVar7 = (ShaderProgramDeclaration *)(local_430[0] + 1);
    operator_delete(local_440,(ulong)pSVar7);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._0_8_ != &local_388) {
    pSVar7 = (ShaderProgramDeclaration *)(local_388._M_allocated_capacity + 1);
    operator_delete((void *)local_398._0_8_,(ulong)pSVar7);
  }
  if (local_368 != &local_358) {
    pSVar7 = (ShaderProgramDeclaration *)(local_358 + 1);
    operator_delete(local_368,(ulong)pSVar7);
  }
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_140);
  (this_01->super_VertexShader)._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_0215f240;
  (this_01->super_GeometryShader)._vptr_GeometryShader = (_func_int **)&DAT_0215f278;
  (this_01->super_FragmentShader)._vptr_FragmentShader = (_func_int **)&DAT_0215f290;
  *(VariableTest *)&this_01->field_0x154 = VVar3;
  this_00->m_program = (BuiltinVariableShader *)this_01;
  iVar6 = GeometryShaderRenderTest::init
                    (&this_00->super_GeometryShaderRenderTest,(EVP_PKEY_CTX *)pSVar7);
  return iVar6;
}

Assistant:

void BuiltinVariableRenderTest::init (void)
{
	// Requirements
	if (m_test == BuiltinVariableShader::TEST_POINT_SIZE)
	{
		const float requiredPointSize = 5.0f;

		tcu::Vec2 range = tcu::Vec2(1.0f, 1.0f);

		if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 4)) && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_point_size"))
			TCU_THROW(NotSupportedError, "Tests require GL_EXT_geometry_point_size extension.");

		m_context.getRenderContext().getFunctions().getFloatv(GL_ALIASED_POINT_SIZE_RANGE, range.getPtr());
		if (range.y() < requiredPointSize)
			throw tcu::NotSupportedError("Test case requires point size " + de::toString(requiredPointSize));
	}

	m_program = new BuiltinVariableShader(m_context.getRenderContext().getType(), m_test);

	// Shader init
	GeometryShaderRenderTest::init();
}